

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void toktleach(toktdef *tab1,_func_void_void_ptr_toksdef_ptr *cb,void *ctx)

{
  int iVar1;
  toksdef *ptVar2;
  
  iVar1 = *(int *)&tab1[1].toktfset;
  if (iVar1 != 0) {
    ptVar2 = (toksdef *)tab1[1].toktfadd;
    do {
      (*cb)(ctx,ptVar2);
      ptVar2 = (toksdef *)(ptVar2->toksnam + ((ulong)(ptVar2->tokslen + 0xf & 0xfffffff8) - 7));
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void toktleach(toktdef *tab1,
               void (*cb)(void *ctx, toksdef *sym), void *ctx)
{
    toksdef  *p;
    uint      cnt;
    toktldef *tab = (toktldef *)tab1;
    
    for (p = (toksdef *)tab->toktlptr, cnt = tab->toktlcnt ; cnt ; --cnt )
    {
        (*cb)(ctx, p);
        p = (toksdef *)(((uchar *)p)
                        + osrndsz(p->tokslen + sizeof(toks1def)));
    }
}